

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall Assimp::HMPImporter::InternReadFile_HMP5(HMPImporter *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint height_00;
  uint width_00;
  aiMesh **ppaVar6;
  aiMesh *this_00;
  ulong uVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  aiNode *this_01;
  uint *puVar10;
  aiVector3t<float> *local_b0;
  aiVector3t<float> *local_88;
  uint local_50;
  uint local_4c;
  uint x;
  uint y;
  Vertex_HMP5 *src;
  aiVector3D *pcNorOut;
  aiVector3D *pcVertOut;
  uint width;
  uint height;
  aiMesh *pcMesh;
  uchar *szCurrent;
  Header_HMP5 *pcHeader;
  HMPImporter *this_local;
  
  szCurrent = (this->super_MDLImporter).mBuffer;
  pcMesh = (aiMesh *)((this->super_MDLImporter).mBuffer + 0x54);
  pcHeader = (Header_HMP5 *)this;
  ValidateHeader_HMP457(this);
  ((this->super_MDLImporter).pScene)->mNumMeshes = 1;
  ppaVar6 = (aiMesh **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMeshes = ppaVar6;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *((this->super_MDLImporter).pScene)->mMeshes = this_00;
  this_00->mMaterialIndex = 0;
  uVar7 = (ulong)*(int *)(szCurrent + 0x3c);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar9 = (aiVector3D *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_88 = paVar9;
    do {
      aiVector3t<float>::aiVector3t(local_88);
      local_88 = local_88 + 1;
    } while (local_88 != paVar9 + uVar7);
  }
  this_00->mVertices = paVar9;
  uVar7 = (ulong)*(int *)(szCurrent + 0x3c);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar7;
  uVar8 = SUB168(auVar5 * ZEXT816(0xc),0);
  if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar9 = (aiVector3D *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_b0 = paVar9;
    do {
      aiVector3t<float>::aiVector3t(local_b0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != paVar9 + uVar7);
  }
  this_00->mNormals = paVar9;
  iVar3 = *(int *)(szCurrent + 0x3c);
  fVar1 = *(float *)(szCurrent + 0x2c);
  height_00 = (uint)(long)((float)iVar3 / fVar1);
  fVar2 = *(float *)(szCurrent + 0x2c);
  width_00 = (uint)(long)fVar2;
  CreateMaterial(this,(uchar *)pcMesh,(uchar **)&pcMesh);
  pcMesh = (aiMesh *)((long)&pcMesh->mTangents + 4);
  MDLImporter::SizeCheck
            (&this->super_MDLImporter,
             (void *)((long)pcMesh->mColors +
                     ((long)((float)iVar3 / fVar1) & 0xffffffffU) * 4 * ((long)fVar2 & 0xffffffffU)
                     + -0x30));
  pcNorOut = this_00->mVertices;
  src = (Vertex_HMP5 *)this_00->mNormals;
  _x = pcMesh;
  for (local_4c = 0; local_4c < height_00; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < width_00; local_50 = local_50 + 1) {
      pcNorOut->x = (float)local_50 * *(float *)(szCurrent + 0x24);
      pcNorOut->y = (float)local_4c * *(float *)(szCurrent + 0x28);
      pcNorOut->z = ((float)(ushort)_x->mPrimitiveTypes / 65535.0 - 0.5) *
                    *(float *)(szCurrent + 0x24) * 8.0;
      MD2::LookupNormalIndex(*(uint8_t *)((long)&_x->mPrimitiveTypes + 2),(aiVector3D *)src);
      pcNorOut = pcNorOut + 1;
      src = src + 3;
      _x = (aiMesh *)&_x->mNumVertices;
    }
  }
  if (*(int *)(szCurrent + 0x30) != 0) {
    GenerateTextureCoords(this,width_00,height_00);
  }
  CreateOutputFaceList(this,width_00,height_00);
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  ((this->super_MDLImporter).pScene)->mRootNode = this_01;
  aiString::Set(&((this->super_MDLImporter).pScene)->mRootNode->mName,"terrain_root");
  ((this->super_MDLImporter).pScene)->mRootNode->mNumMeshes = 1;
  puVar10 = (uint *)operator_new__(4);
  ((this->super_MDLImporter).pScene)->mRootNode->mMeshes = puVar10;
  *((this->super_MDLImporter).pScene)->mRootNode->mMeshes = 0;
  return;
}

Assistant:

void HMPImporter::InternReadFile_HMP5( )
{
    // read the file header and skip everything to byte 84
    const HMP::Header_HMP5* pcHeader = (const HMP::Header_HMP5*)mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(mBuffer+84);
    ValidateHeader_HMP457();

    // generate an output mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();

    pcMesh->mMaterialIndex = 0;
    pcMesh->mVertices = new aiVector3D[pcHeader->numverts];
    pcMesh->mNormals = new aiVector3D[pcHeader->numverts];

    const unsigned int height = (unsigned int)(pcHeader->numverts / pcHeader->fnumverts_x);
    const unsigned int width =  (unsigned int)pcHeader->fnumverts_x;

    // generate/load a material for the terrain
    CreateMaterial(szCurrent,&szCurrent);

    // goto offset 120, I don't know why ...
    // (fixme) is this the frame header? I assume yes since it starts with 2.
    szCurrent += 36;
    SizeCheck(szCurrent + sizeof(const HMP::Vertex_HMP7)*height*width);

    // now load all vertices from the file
    aiVector3D* pcVertOut = pcMesh->mVertices;
    aiVector3D* pcNorOut = pcMesh->mNormals;
    const HMP::Vertex_HMP5* src = (const HMP::Vertex_HMP5*) szCurrent;
    for (unsigned int y = 0; y < height;++y)
    {
        for (unsigned int x = 0; x < width;++x)
        {
            pcVertOut->x = x * pcHeader->ftrisize_x;
            pcVertOut->y = y * pcHeader->ftrisize_y;
            pcVertOut->z = (((float)src->z / 0xffff)-0.5f) * pcHeader->ftrisize_x * 8.0f;
            MD2::LookupNormalIndex(src->normals162index, *pcNorOut );
            ++pcVertOut;++pcNorOut;++src;
        }
    }

    // generate texture coordinates if necessary
    if (pcHeader->numskins)
        GenerateTextureCoords(width,height);

    // now build a list of faces
    CreateOutputFaceList(width,height);

    // there is no nodegraph in HMP files. Simply assign the one mesh
    // (no, not the one ring) to the root node
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("terrain_root");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
}